

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

MIR_type_t get_mir_type(c2m_ctx_t c2m_ctx,type *type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mir_size_t size_00;
  MIR_type_t local_3c;
  MIR_type_t local_38;
  MIR_type_t local_34;
  int signed_p;
  int int_p;
  size_t size;
  type *type_local;
  c2m_ctx_t c2m_ctx_local;
  
  size_00 = raw_type_size(c2m_ctx,type);
  iVar1 = floating_type_p(type);
  iVar2 = signed_integer_type_p(type);
  iVar3 = scalar_type_p(type);
  if (iVar3 == 0) {
    c2m_ctx_local._4_4_ = MIR_T_UNDEF;
  }
  else {
    if (((type->mode != TM_BASIC) && (type->mode != TM_PTR)) && (type->mode != TM_ENUM)) {
      __assert_fail("type->mode == TM_BASIC || type->mode == TM_PTR || type->mode == TM_ENUM",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2831,"MIR_type_t get_mir_type(c2m_ctx_t, struct type *)");
    }
    if (iVar1 == 0) {
      if (((2 < size_00) && (size_00 != 4)) && (size_00 != 8)) {
        __assert_fail("size <= 2 || size == 4 || size == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2836,"MIR_type_t get_mir_type(c2m_ctx_t, struct type *)");
      }
      if (iVar2 == 0) {
        if (size_00 == 1) {
          local_38 = MIR_T_U8;
        }
        else {
          if (size_00 == 2) {
            local_3c = MIR_T_U16;
          }
          else {
            local_3c = MIR_T_U64;
            if (size_00 == 4) {
              local_3c = MIR_T_U32;
            }
          }
          local_38 = local_3c;
        }
        c2m_ctx_local._4_4_ = local_38;
      }
      else {
        c2m_ctx_local._4_4_ = get_int_mir_type(size_00);
      }
    }
    else {
      if (((size_00 != 4) && (size_00 != 8)) && (size_00 != 0x10)) {
        __assert_fail("size == 4 || size == 8 || size == sizeof (mir_ldouble)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2833,"MIR_type_t get_mir_type(c2m_ctx_t, struct type *)");
      }
      if (size_00 == 4) {
        local_34 = MIR_T_F;
      }
      else {
        local_34 = MIR_T_LD;
        if (size_00 == 8) {
          local_34 = MIR_T_D;
        }
      }
      c2m_ctx_local._4_4_ = local_34;
    }
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static MIR_type_t get_mir_type (c2m_ctx_t c2m_ctx, struct type *type) {
  size_t size = raw_type_size (c2m_ctx, type);
  int int_p = !floating_type_p (type), signed_p = signed_integer_type_p (type);

  if (!scalar_type_p (type)) return MIR_T_UNDEF;
  assert (type->mode == TM_BASIC || type->mode == TM_PTR || type->mode == TM_ENUM);
  if (!int_p) {
    assert (size == 4 || size == 8 || size == sizeof (mir_ldouble));
    return size == 4 ? MIR_T_F : size == 8 ? MIR_T_D : MIR_T_LD;
  }
  assert (size <= 2 || size == 4 || size == 8);
  if (signed_p) return get_int_mir_type (size);
  return size == 1 ? MIR_T_U8 : size == 2 ? MIR_T_U16 : size == 4 ? MIR_T_U32 : MIR_T_U64;
}